

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::initialize_slots(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *this)

{
  ctrl_t *__s;
  ulong uVar1;
  Layout LVar2;
  
  if (this->capacity_ == 0) {
    __assert_fail("capacity_",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x70a,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::initialize_slots() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  LVar2 = MakeLayout(this->capacity_);
  uVar1 = LVar2.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>
          .size_[0] + 7 & 0xfffffffffffffff8;
  __s = (ctrl_t *)
        Allocate<8ul,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                  ((allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>
                    *)&this->settings_,
                   uVar1 + LVar2.
                           super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>
                           .size_[1] * 0x18);
  if (((ulong)__s & 7) == 0) {
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)(__s + uVar1);
    memset(__s,0x80,this->capacity_ + 0x10);
    this->ctrl_[this->capacity_] = -1;
    reset_growth_left(this);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xfc7,
                "CopyConst<Char, ElementType<N>> *phmap::container_internal::internal_layout::LayoutImpl<std::tuple<signed char, phmap::container_internal::map_slot_type<unsigned long, std::pair<unsigned long, unsigned long>>>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::container_internal::map_slot_type<unsigned long, std::pair<unsigned long, unsigned long>>>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
               );
}

Assistant:

void initialize_slots() {
        assert(capacity_);
        if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value && 
            slots_ == nullptr) {
            infoz_ = Sample();
        }

        auto layout = MakeLayout(capacity_);
        char* mem = static_cast<char*>(
            Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
        ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
        slots_ = layout.template Pointer<1>(mem);
        reset_ctrl();
        reset_growth_left();
        infoz_.RecordStorageChanged(size_, capacity_);
    }